

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O2

bool bc7decomp::unpack_bc7(void *pBlock,color_rgba *pPixels)

{
  undefined1 uVar1;
  uint32_t mode;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 8) {
      return false;
    }
    if ((*pBlock >> (uVar2 & 0x1f) & 1) != 0) break;
    uVar2 = uVar2 + 1;
  }
  uVar1 = (*(code *)(&DAT_0011dcf0 + *(int *)(&DAT_0011dcf0 + (ulong)uVar2 * 4)))
                    (pBlock,pBlock,pPixels);
  return (bool)uVar1;
}

Assistant:

bool unpack_bc7(const void *pBlock, color_rgba *pPixels)
{
	const uint32_t first_byte = static_cast<const uint8_t*>(pBlock)[0];

	for (uint32_t mode = 0; mode <= 7; mode++)
	{
		if (first_byte & (1U << mode))
		{
			switch (mode)
			{
			case 0:
			case 2:
				return unpack_bc7_mode0_2(mode, pBlock, pPixels);
			case 1:
			case 3:
			case 7:
				return unpack_bc7_mode1_3_7(mode, pBlock, pPixels);
			case 4:
			case 5:
				return unpack_bc7_mode4_5(mode, pBlock, pPixels);
			case 6:
				return unpack_bc7_mode6(pBlock, pPixels);
			default:
				break;
			}
		}
	}

	return false;
}